

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O0

bool __thiscall Js::EntryPointInfo::IsNativeCode(EntryPointInfo *this)

{
  State SVar1;
  undefined1 local_11;
  EntryPointInfo *this_local;
  
  SVar1 = GetState(this);
  local_11 = true;
  if (SVar1 != CodeGenRecorded) {
    SVar1 = GetState(this);
    local_11 = SVar1 == CodeGenDone;
  }
  return local_11;
}

Assistant:

bool IsNativeCode() const
        {
#if ENABLE_NATIVE_CODEGEN
            return this->GetState() == CodeGenRecorded ||
                this->GetState() == CodeGenDone;
#else
            return false;
#endif
        }